

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  uint64_t uVar345;
  uint64_t uVar346;
  uint64_t uVar347;
  ulong uVar348;
  secp256k1_gej *psVar349;
  secp256k1_gej *psVar350;
  ulong uVar351;
  byte bVar352;
  int iVar353;
  long lVar354;
  int iVar355;
  ulong uVar356;
  secp256k1_gej *a;
  uint uVar357;
  ulong uVar358;
  ulong uVar359;
  ulong uVar360;
  long unaff_RBP;
  int iVar361;
  secp256k1_gej *psVar362;
  secp256k1_gej *psVar363;
  secp256k1_gej *psVar364;
  secp256k1_gej *psVar365;
  ulong uVar366;
  ulong uVar367;
  uint64_t *puVar368;
  uint64_t *puVar369;
  secp256k1_gej *psVar370;
  int iVar371;
  secp256k1_gej *psVar372;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar373;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar374;
  secp256k1_gej *psVar375;
  secp256k1_fe *a_00;
  ulong uVar376;
  secp256k1_modinv64_modinfo *psVar377;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  secp256k1_ge sStack_758;
  secp256k1_ge sStack_6f0;
  secp256k1_gej sStack_688;
  secp256k1_gej *psStack_5f0;
  secp256k1_gej *psStack_5e8;
  secp256k1_gej *psStack_5e0;
  secp256k1_gej *psStack_5d8;
  secp256k1_gej *psStack_5d0;
  secp256k1_gej *psStack_5c0;
  secp256k1_gej *psStack_5b8;
  ulong uStack_5b0;
  secp256k1_gej *psStack_5a8;
  secp256k1_fe *psStack_5a0;
  secp256k1_gej *psStack_598;
  secp256k1_gej *psStack_590;
  secp256k1_gej *psStack_588;
  ulong uStack_580;
  secp256k1_gej *psStack_578;
  secp256k1_gej *psStack_570;
  secp256k1_gej *psStack_568;
  secp256k1_gej *psStack_560;
  secp256k1_gej *psStack_558;
  secp256k1_gej *psStack_550;
  undefined1 auStack_548 [56];
  uint64_t uStack_510;
  uint64_t uStack_508;
  uint64_t uStack_500;
  uint64_t uStack_4f8;
  uint uStack_4f0;
  undefined1 auStack_4e8 [56];
  uint64_t uStack_4b0;
  uint64_t uStack_4a8;
  uint64_t uStack_4a0;
  uint64_t uStack_498;
  int iStack_490;
  undefined1 auStack_488 [56];
  uint64_t uStack_450;
  uint64_t uStack_448;
  uint64_t uStack_440;
  uint64_t uStack_438;
  int iStack_430;
  int iStack_42c;
  ulong uStack_420;
  undefined1 auStack_418 [56];
  secp256k1_gej *psStack_3e0;
  secp256k1_gej *psStack_3d8;
  secp256k1_gej *psStack_3d0;
  ulong uStack_3c8;
  ulong uStack_3c0;
  undefined1 auStack_3b8 [64];
  ulong uStack_378;
  ulong uStack_370;
  ulong uStack_368;
  long lStack_360;
  uint64_t uStack_358;
  secp256k1_fe sStack_350;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  secp256k1_fe *psStack_308;
  secp256k1_gej *psStack_300;
  secp256k1_gej *psStack_2f8;
  ulong uStack_2e8;
  secp256k1_gej *psStack_2e0;
  ulong uStack_2d8;
  undefined1 auStack_2d0 [56];
  uint64_t uStack_298;
  uint64_t uStack_290;
  uint64_t uStack_288;
  uint64_t uStack_280;
  int iStack_278;
  int iStack_274;
  secp256k1_gej *psStack_268;
  secp256k1_gej *psStack_260;
  secp256k1_gej *psStack_258;
  secp256k1_gej *psStack_250;
  secp256k1_gej *psStack_248;
  code *pcStack_240;
  ulong uStack_230;
  secp256k1_gej *psStack_228;
  undefined1 auStack_220 [40];
  undefined1 auStack_1f8 [104];
  secp256k1_gej *psStack_190;
  secp256k1_gej *psStack_188;
  secp256k1_gej *psStack_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  uint64_t uStack_160;
  uint64_t uStack_158;
  int iStack_150;
  int iStack_14c;
  secp256k1_gej *psStack_140;
  secp256k1_fe sStack_e8;
  uchar *puStack_b8;
  uint32_t local_84;
  ulong local_20;
  
  psVar374 = (secp256k1_gej *)&stack0xffffffffffffff80;
  psVar362 = psVar374;
  for (lVar354 = 0xd; lVar354 != 0; lVar354 = lVar354 + -1) {
    (psVar362->x).n[0] = *(uint64_t *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar362 = (secp256k1_gej *)((psVar362->x).n + 1);
  }
  uVar376 = local_20 >> 6;
  local_84 = cnt;
  secp256k1_sha256_write((secp256k1_sha256 *)psVar374,(uchar *)&local_84,4);
  psVar362 = (secp256k1_gej *)out32;
  psVar365 = psVar374;
  secp256k1_sha256_finalize((secp256k1_sha256 *)psVar374,out32);
  psVar377 = (secp256k1_modinv64_modinfo *)(uVar376 + 1);
  if ((secp256k1_gej *)(local_20 >> 6) == (secp256k1_gej *)psVar377) {
    return;
  }
  secp256k1_ellswift_prng_cold_1();
  psVar364 = psVar365;
  puStack_b8 = out32;
  secp256k1_fe_verify(&psVar365->x);
  if ((psVar365->x).magnitude < 9) {
    uVar376 = (psVar365->x).n[0];
    uVar367 = (psVar365->x).n[1];
    uVar356 = (psVar365->x).n[2];
    uVar351 = (psVar365->x).n[3];
    uVar360 = (psVar365->x).n[4];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar376 * 2;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar351;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar367 * 2;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar356;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar360;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar360;
    uVar348 = SUB168(auVar3 * auVar163,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar348 & 0xfffffffffffff;
    auVar1 = auVar2 * auVar162 + auVar1 * auVar161 + auVar4 * ZEXT816(0x1000003d10);
    uVar358 = auVar1._0_8_;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uVar358 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar360 = uVar360 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar376;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar360;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar367 * 2;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar351;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar356;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar356;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar348 >> 0x34 | SUB168(auVar3 * auVar163,8) << 0xc;
    auVar1 = auVar5 * auVar164 + auVar289 + auVar6 * auVar165 + auVar7 * auVar166 +
             auVar8 * ZEXT816(0x1000003d10);
    uVar348 = auVar1._0_8_;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = uVar348 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar376;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar376;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar367;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar360;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar356 * 2;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar351;
    auVar1 = auVar10 * auVar168 + auVar290 + auVar11 * auVar169;
    uVar359 = auVar1._0_8_;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uVar359 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = (uVar359 & 0xfffffffffffff) << 4 | (uVar348 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar9 * auVar167 + ZEXT816(0x1000003d1) * auVar170;
    uVar359 = auVar1._0_8_;
    sStack_e8.n[0] = uVar359 & 0xfffffffffffff;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = uVar359 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar376 * 2;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar367;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar356;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar360;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar351;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar351;
    auVar2 = auVar13 * auVar172 + auVar292 + auVar14 * auVar173;
    uVar359 = auVar2._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar359 & 0xfffffffffffff;
    auVar1 = auVar12 * auVar171 + auVar291 + auVar15 * ZEXT816(0x1000003d10);
    uVar366 = auVar1._0_8_;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = uVar359 >> 0x34 | auVar2._8_8_ << 0xc;
    sStack_e8.n[1] = uVar366 & 0xfffffffffffff;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar366 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar376 * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar356;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar367;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar367;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar351;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar360;
    auVar294 = auVar18 * auVar176 + auVar294;
    uVar376 = auVar294._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar16 * auVar174 + auVar293 + auVar17 * auVar175 + auVar19 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    sStack_e8.n[2] = uVar367 & 0xfffffffffffff;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = (uVar367 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar358 & 0xfffffffffffff);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar376 >> 0x34 | auVar294._8_8_ << 0xc;
    auVar295 = auVar20 * ZEXT816(0x1000003d10) + auVar295;
    uVar376 = auVar295._0_8_;
    sStack_e8.n[3] = uVar376 & 0xfffffffffffff;
    sStack_e8.n[4] = (uVar376 >> 0x34 | auVar295._8_8_ << 0xc) + (uVar348 & 0xffffffffffff);
    sStack_e8.magnitude = 1;
    sStack_e8.normalized = 0;
    secp256k1_fe_verify(&sStack_e8);
    secp256k1_fe_mul(&sStack_e8,&sStack_e8,&psVar365->x);
    secp256k1_fe_verify(&sStack_e8);
    sStack_e8.n[0] = sStack_e8.n[0] + 2;
    sStack_e8.normalized = 0;
    sStack_e8.magnitude = sStack_e8.magnitude + 1;
    secp256k1_fe_verify(&sStack_e8);
    secp256k1_fe_is_square_var(&sStack_e8);
    return;
  }
  secp256k1_ge_x_on_curve_var_cold_1();
  uStack_178 = (psVar364->x).n[0];
  uStack_170 = (psVar364->x).n[1];
  uStack_168 = (psVar364->x).n[2];
  uStack_160 = (psVar364->x).n[3];
  uStack_158 = (psVar364->x).n[4];
  iStack_150 = (psVar364->x).magnitude;
  iStack_14c = (psVar364->x).normalized;
  pcStack_240 = (code *)0x122f0e;
  psStack_140 = psVar365;
  secp256k1_fe_verify(&psVar364->x);
  auStack_1f8._48_8_ = (psVar364->x).n[0];
  auStack_1f8._56_8_ = (psVar364->x).n[1];
  auStack_1f8._64_8_ = (psVar364->x).n[2];
  auStack_1f8._72_8_ = (psVar364->x).n[3];
  auStack_1f8._80_8_ = (psVar364->x).n[4];
  auStack_1f8._88_4_ = (psVar364->x).magnitude;
  auStack_1f8._92_4_ = (psVar364->x).normalized;
  psVar365 = (secp256k1_gej *)(auStack_1f8 + 0x30);
  pcStack_240 = (code *)0x122f31;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar365);
  pcStack_240 = (code *)0x122f39;
  psVar364 = psVar365;
  secp256k1_fe_verify((secp256k1_fe *)psVar365);
  if (auStack_1f8._92_4_ == 0) {
LAB_001234da:
    pcStack_240 = (code *)0x1234df;
    secp256k1_fe_is_square_var_cold_19();
LAB_001234df:
    pcStack_240 = (code *)0x1234e4;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((auStack_1f8._64_8_ == 0 && auStack_1f8._72_8_ == 0) &&
        (auStack_1f8._56_8_ == 0 && auStack_1f8._48_8_ == 0)) && auStack_1f8._80_8_ == 0) {
      psVar365 = (secp256k1_gej *)0x1;
    }
    else {
      auStack_220._0_8_ = (auStack_1f8._56_8_ << 0x34 | auStack_1f8._48_8_) & 0x3fffffffffffffff;
      auStack_220._8_8_ =
           (ulong)((uint)auStack_1f8._64_8_ & 0xfffff) << 0x2a | (ulong)auStack_1f8._56_8_ >> 10;
      auStack_220._16_8_ =
           (ulong)((uint)auStack_1f8._72_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_1f8._64_8_ >> 0x14;
      psVar364 = (secp256k1_gej *)
                 ((auStack_1f8._80_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_1f8._72_8_ >> 0x1e);
      auStack_220._32_8_ = (ulong)auStack_1f8._80_8_ >> 0x28;
      auStack_1f8._16_8_ = 0;
      auStack_1f8._24_8_ = 0;
      auStack_1f8._0_8_ = -0x1000003d1;
      auStack_1f8._8_8_ = 0;
      auStack_1f8._32_8_ = 0x100;
      psVar362 = (secp256k1_gej *)(auStack_220._8_8_ | auStack_220._0_8_);
      auStack_220._24_8_ = psVar364;
      if (((auStack_220._32_8_ == 0 && auStack_220._16_8_ == 0) && psVar362 == (secp256k1_gej *)0x0)
          && psVar364 == (secp256k1_gej *)0x0) goto LAB_001234df;
      psVar374 = (secp256k1_gej *)0x5;
      unaff_RBP = -1;
      uVar376 = 0;
      unaff_R13 = (secp256k1_gej *)0xfffffffefffffc2f;
      psVar365 = (secp256k1_gej *)0x0;
      do {
        psVar364 = (secp256k1_gej *)(auStack_1f8._8_8_ << 0x3e | (ulong)unaff_R13);
        puVar368 = (uint64_t *)(auStack_220._8_8_ << 0x3e | auStack_220._0_8_);
        psVar349 = (secp256k1_gej *)0x0;
        psVar363 = (secp256k1_gej *)0x0;
        unaff_R13 = (secp256k1_gej *)0x1;
        iVar355 = 0x3e;
        psVar375 = (secp256k1_gej *)0x1;
        puVar369 = puVar368;
        psVar373 = psVar364;
        unaff_R12 = psVar365;
        while( true ) {
          uVar367 = -1L << ((byte)iVar355 & 0x3f) | (ulong)puVar369;
          lVar354 = 0;
          if (uVar367 != 0) {
            for (; (uVar367 >> lVar354 & 1) == 0; lVar354 = lVar354 + 1) {
            }
          }
          bVar352 = (byte)lVar354;
          psVar370 = (secp256k1_gej *)((ulong)puVar369 >> (bVar352 & 0x3f));
          psVar375 = (secp256k1_gej *)((long)psVar375 << (bVar352 & 0x3f));
          psVar349 = (secp256k1_gej *)((long)psVar349 << (bVar352 & 0x3f));
          unaff_RBP = unaff_RBP - lVar354;
          psVar362 = (secp256k1_gej *)((ulong)psVar373 >> 2);
          uVar357 = ((uint)((ulong)psVar373 >> 1) ^ (uint)psVar362) & (uint)lVar354 ^
                    (uint)unaff_R12;
          psVar365 = (secp256k1_gej *)(ulong)uVar357;
          iVar355 = iVar355 - (uint)lVar354;
          uStack_230 = uVar376;
          psStack_228 = psVar374;
          if (iVar355 == 0) break;
          if (((ulong)psVar373 & 1) == 0) {
            pcStack_240 = (code *)0x12348f;
            secp256k1_fe_is_square_var_cold_7();
LAB_0012348f:
            pcStack_240 = (code *)0x123494;
            secp256k1_fe_is_square_var_cold_6();
LAB_00123494:
            pcStack_240 = (code *)0x123499;
            secp256k1_fe_is_square_var_cold_1();
LAB_00123499:
            pcStack_240 = (code *)0x12349e;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_0012349e;
          }
          if (((ulong)psVar370 & 1) == 0) goto LAB_0012348f;
          psVar362 = (secp256k1_gej *)
                     ((long)psVar349 * (long)puVar368 + (long)psVar375 * (long)psVar364);
          bVar352 = 0x3e - (char)iVar355;
          psVar377 = (secp256k1_modinv64_modinfo *)((long)psVar373 << (bVar352 & 0x3f));
          if (psVar362 != (secp256k1_gej *)psVar377) goto LAB_00123494;
          psVar377 = (secp256k1_modinv64_modinfo *)
                     ((long)unaff_R13 * (long)puVar368 + (long)psVar363 * (long)psVar364);
          psVar362 = (secp256k1_gej *)((long)psVar370 << (bVar352 & 0x3f));
          if ((secp256k1_gej *)psVar377 != psVar362) goto LAB_00123499;
          iVar371 = (int)psVar373;
          iVar361 = (int)psVar370;
          if (unaff_RBP < 0) {
            unaff_RBP = -unaff_RBP;
            iVar353 = (int)unaff_RBP + 1;
            if (iVar355 <= iVar353) {
              iVar353 = iVar355;
            }
            psVar362 = (secp256k1_gej *)(ulong)(iVar353 - 0x3fU);
            if (0xffffffc1 < iVar353 - 0x3fU) {
              psVar365 = (secp256k1_gej *)
                         (ulong)(uVar357 ^ (uint)(((ulong)psVar370 & (ulong)psVar373) >> 1));
              psVar377 = (secp256k1_modinv64_modinfo *)
                         ((ulong)(0x3fL << (-(char)iVar353 & 0x3fU)) >> (-(char)iVar353 & 0x3fU));
              uVar357 = (iVar361 * iVar361 + 0x3e) * iVar361 * iVar371 & (uint)psVar377;
              psVar350 = psVar349;
              psVar349 = unaff_R13;
              psVar362 = psVar375;
              psVar372 = psVar373;
              psVar373 = psVar370;
              psVar375 = psVar363;
              goto LAB_001231c3;
            }
            goto LAB_001234a8;
          }
          iVar353 = (int)unaff_RBP + 1;
          if (iVar355 <= iVar353) {
            iVar353 = iVar355;
          }
          psVar362 = (secp256k1_gej *)(ulong)(iVar353 - 0x3fU);
          if (iVar353 - 0x3fU < 0xffffffc2) goto LAB_001234a3;
          psVar377 = (secp256k1_modinv64_modinfo *)
                     ((ulong)(0xfL << (-(char)iVar353 & 0x3fU)) >> (-(char)iVar353 & 0x3fU));
          uVar357 = -(iVar361 * ((iVar371 * 2 + 2U & 8) + iVar371)) & (uint)psVar377;
          psVar350 = unaff_R13;
          psVar362 = psVar363;
          psVar372 = psVar370;
LAB_001231c3:
          uVar367 = (ulong)uVar357;
          puVar369 = (uint64_t *)((long)(psVar372->x).n + uVar367 * (long)psVar373);
          psVar363 = (secp256k1_gej *)((long)(psVar362->x).n + (long)psVar375 * uVar367);
          unaff_R13 = (secp256k1_gej *)((long)(psVar350->x).n + uVar367 * (long)psVar349);
          unaff_R12 = psVar365;
          if (((ulong)puVar369 & (ulong)psVar377) != 0) {
LAB_0012349e:
            pcStack_240 = (code *)0x1234a3;
            secp256k1_fe_is_square_var_cold_4();
LAB_001234a3:
            pcStack_240 = (code *)0x1234a8;
            secp256k1_fe_is_square_var_cold_3();
LAB_001234a8:
            pcStack_240 = (code *)0x1234ad;
            secp256k1_fe_is_square_var_cold_5();
            goto LAB_001234ad;
          }
        }
        psVar364 = (secp256k1_gej *)((long)psVar349 * (long)psVar363);
        lVar354 = (long)psVar375 * (long)unaff_R13 - (long)psVar364;
        uVar376 = (ulong)((secp256k1_gej *)((long)psVar375 * (long)unaff_R13) < psVar364);
        uVar367 = SUB168(SEXT816((long)psVar375) * SEXT816((long)unaff_R13),8) -
                  SUB168(SEXT816((long)psVar349) * SEXT816((long)psVar363),8);
        psVar377 = &secp256k1_const_modinfo_fe;
        unaff_R12 = (secp256k1_gej *)auStack_1f8;
        auStack_1f8._96_8_ = psVar375;
        psStack_190 = psVar349;
        psStack_188 = psVar363;
        psStack_180 = unaff_R13;
        if ((lVar354 != 0x4000000000000000 || uVar367 != uVar376) &&
           (uVar367 - uVar376 != -1 || lVar354 != -0x4000000000000000)) {
LAB_001234ad:
          pcStack_240 = (code *)0x1234b2;
          secp256k1_fe_is_square_var_cold_16();
          psVar374 = psVar375;
LAB_001234b2:
          pcStack_240 = (code *)0x1234b7;
          secp256k1_fe_is_square_var_cold_15();
LAB_001234b7:
          pcStack_240 = (code *)0x1234bc;
          secp256k1_fe_is_square_var_cold_14();
LAB_001234bc:
          pcStack_240 = (code *)0x1234c1;
          secp256k1_fe_is_square_var_cold_13();
LAB_001234c1:
          pcStack_240 = (code *)0x1234c6;
          secp256k1_fe_is_square_var_cold_12();
LAB_001234c6:
          pcStack_240 = (code *)0x1234cb;
          secp256k1_fe_is_square_var_cold_11();
LAB_001234cb:
          pcStack_240 = (code *)0x1234d0;
          secp256k1_fe_is_square_var_cold_10();
LAB_001234d0:
          pcStack_240 = (code *)0x1234d5;
          secp256k1_fe_is_square_var_cold_9();
LAB_001234d5:
          pcStack_240 = (code *)0x1234da;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_001234da;
        }
        iVar361 = (int)psVar374;
        pcStack_240 = (code *)0x12326e;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar355 < 1) goto LAB_001234b2;
        pcStack_240 = (code *)0x123289;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar355) goto LAB_001234b7;
        unaff_R13 = (secp256k1_gej *)auStack_220;
        pcStack_240 = (code *)0x1232a6;
        psVar362 = psVar374;
        psVar364 = unaff_R13;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar355 < 1) goto LAB_001234bc;
        pcStack_240 = (code *)0x1232c1;
        psVar362 = psVar374;
        psVar364 = unaff_R13;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar355) goto LAB_001234c1;
        pcStack_240 = (code *)0x1232df;
        secp256k1_modinv64_update_fg_62_var
                  (iVar361,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_R13,
                   (secp256k1_modinv64_trans2x2 *)(auStack_1f8 + 0x60));
        unaff_R13 = (secp256k1_gej *)auStack_1f8._0_8_;
        if ((secp256k1_gej *)auStack_1f8._0_8_ == (secp256k1_gej *)0x1) {
          if (1 < iVar361) {
            psVar362 = (secp256k1_gej *)0x1;
            uVar376 = 0;
            do {
              uVar376 = uVar376 | *(ulong *)(auStack_1f8 + (long)psVar362 * 8);
              psVar362 = (secp256k1_gej *)((long)(psVar362->x).n + 1);
            } while (psVar374 != psVar362);
            if (uVar376 != 0) goto LAB_00123314;
          }
          psVar365 = (secp256k1_gej *)(ulong)(~uVar357 & 1);
          goto LAB_001233cb;
        }
LAB_00123314:
        lVar354 = (long)iVar361;
        if ((-1 < lVar354 + -2 && *(long *)(auStack_1f8 + lVar354 * 8 + -8) == 0) &&
            (&psStack_228)[lVar354] == (secp256k1_gej *)0x0) {
          psVar374 = (secp256k1_gej *)(ulong)(iVar361 - 1);
        }
        pcStack_240 = (code *)0x123341;
        iVar361 = (int)psVar374;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar355 < 1) goto LAB_001234c6;
        pcStack_240 = (code *)0x12335c;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar355) goto LAB_001234cb;
        unaff_R12 = (secp256k1_gej *)auStack_220;
        pcStack_240 = (code *)0x123379;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar355 < 1) goto LAB_001234d0;
        pcStack_240 = (code *)0x123394;
        psVar362 = psVar374;
        psVar364 = unaff_R12;
        iVar355 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar361,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar355) goto LAB_001234d5;
        uVar357 = (int)uStack_230 + 1;
        uVar376 = (ulong)uVar357;
      } while (uVar357 != 0xc);
      pcStack_240 = (code *)0x1233bb;
      uVar357 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_1f8,(secp256k1_fe *)(auStack_1f8 + 0x30));
      psVar365 = (secp256k1_gej *)(ulong)uVar357;
    }
LAB_001233cb:
    psVar374 = (secp256k1_gej *)&uStack_178;
    pcStack_240 = (code *)0x1233db;
    secp256k1_fe_verify((secp256k1_fe *)psVar374);
    uStack_178 = (uStack_158 >> 0x30) * 0x1000003d1 + uStack_178;
    uStack_170 = (uStack_178 >> 0x34) + uStack_170;
    uStack_168 = (uStack_170 >> 0x34) + uStack_168;
    uVar376 = (uStack_168 >> 0x34) + uStack_160;
    uStack_160 = uVar376 & 0xfffffffffffff;
    uStack_158 = (uVar376 >> 0x34) + (uStack_158 & 0xffffffffffff);
    uStack_168 = uStack_168 & 0xfffffffffffff;
    uStack_170 = uStack_170 & 0xfffffffffffff;
    uStack_178 = uStack_178 & 0xfffffffffffff;
    iStack_150 = 1;
    pcStack_240 = (code *)0x123465;
    secp256k1_fe_verify((secp256k1_fe *)psVar374);
    psVar364 = (secp256k1_gej *)(auStack_1f8 + 0x30);
    pcStack_240 = (code *)0x123472;
    psVar362 = psVar374;
    iVar355 = secp256k1_fe_sqrt((secp256k1_fe *)psVar364,(secp256k1_fe *)psVar374);
    if ((int)psVar365 == iVar355) {
      return;
    }
  }
  pcStack_240 = secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_18();
  a_00 = (secp256k1_fe *)0xfffffffffffff;
  psVar349 = (secp256k1_gej *)0x1000003d0;
  psStack_2f8 = (secp256k1_gej *)0x12351c;
  psStack_268 = psVar365;
  psStack_260 = unaff_R12;
  psStack_258 = unaff_R13;
  psStack_250 = psVar374;
  psStack_248 = (secp256k1_gej *)psVar377;
  pcStack_240 = (code *)unaff_RBP;
  secp256k1_fe_verify(&psVar362->x);
  uVar376 = (psVar362->x).n[4];
  uVar367 = (uVar376 >> 0x30) * 0x1000003d1 + (psVar362->x).n[0];
  if (((uVar367 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar367 & 0xfffffffffffff) == 0)) {
    uVar356 = (uVar367 >> 0x34) + (psVar362->x).n[1];
    psVar374 = (secp256k1_gej *)((uVar356 >> 0x34) + (psVar362->x).n[2]);
    psVar365 = (secp256k1_gej *)(((ulong)psVar374 >> 0x34) + (psVar362->x).n[3]);
    uVar376 = ((ulong)psVar365 >> 0x34) + (uVar376 & 0xffffffffffff);
    if ((((uVar356 | uVar367 | (ulong)psVar374 | (ulong)psVar365) & 0xfffffffffffff) != 0 ||
         uVar376 != 0) &&
       (((uVar367 | 0x1000003d0) & uVar356 & (ulong)psVar374 & (ulong)psVar365 &
        (uVar376 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_001235c2;
    psStack_2f8 = (secp256k1_gej *)0x123d98;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
LAB_00123d98:
    psStack_2f8 = (secp256k1_gej *)0x123d9d;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_00123d9d:
    psStack_2f8 = (secp256k1_gej *)0x123da2;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
LAB_00123da2:
    psVar375 = unaff_R13;
    psVar373 = unaff_R12;
    psStack_2f8 = (secp256k1_gej *)0x123da7;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00123da7:
    psStack_2f8 = (secp256k1_gej *)0x123dac;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  else {
LAB_001235c2:
    psStack_2f8 = (secp256k1_gej *)0x1235d2;
    psVar374 = psVar362;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_2d0 + 0x30),&psVar362->x,&psVar364->x);
    psStack_2f8 = (secp256k1_gej *)0x1235da;
    psVar365 = psVar364;
    secp256k1_fe_verify(&psVar364->x);
    if (8 < (psVar364->x).magnitude) goto LAB_00123d98;
    a_00 = (secp256k1_fe *)auStack_2d0;
    uVar376 = (psVar364->x).n[0];
    uVar367 = (psVar364->x).n[1];
    unaff_R12 = (secp256k1_gej *)(psVar364->x).n[2];
    unaff_R13 = (secp256k1_gej *)(psVar364->x).n[3];
    uVar356 = (psVar364->x).n[4];
    psVar349 = (secp256k1_gej *)0xfffffffffffff;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar376 * 2;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = unaff_R13;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar367 * 2;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = unaff_R12;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar356;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar356;
    uVar351 = SUB168(auVar23 * auVar179,0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar351 & 0xfffffffffffff;
    auVar1 = auVar22 * auVar178 + auVar21 * auVar177 + auVar24 * ZEXT816(0x1000003d10);
    uVar360 = auVar1._0_8_;
    uStack_2d8 = uVar360 & 0xfffffffffffff;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar356 = uVar356 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar376;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar356;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar367 * 2;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = unaff_R13;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = unaff_R12;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = unaff_R12;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar351 >> 0x34 | SUB168(auVar23 * auVar179,8) << 0xc;
    auVar1 = auVar25 * auVar180 + auVar296 + auVar26 * auVar181 + auVar27 * auVar182 +
             auVar28 * ZEXT816(0x1000003d10);
    uVar351 = auVar1._0_8_;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_2e8 = (uVar351 & 0xfffffffffffff) >> 0x30;
    psStack_2e0 = (secp256k1_gej *)(uVar351 & 0xffffffffffff);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar376;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar376;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar367;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar356;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (long)unaff_R12 * 2;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = unaff_R13;
    auVar1 = auVar30 * auVar184 + auVar297 + auVar31 * auVar185;
    uVar351 = auVar1._0_8_;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = (uVar351 & 0xfffffffffffff) << 4 | uStack_2e8;
    auVar1 = auVar29 * auVar183 + ZEXT816(0x1000003d1) * auVar186;
    uVar351 = auVar1._0_8_;
    auStack_2d0._0_8_ = uVar351 & 0xfffffffffffff;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar376 * 2;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar367;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = unaff_R12;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar356;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = unaff_R13;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = unaff_R13;
    auVar2 = auVar33 * auVar188 + auVar299 + auVar34 * auVar189;
    uVar351 = auVar2._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar351 & 0xfffffffffffff;
    auVar1 = auVar32 * auVar187 + auVar298 + auVar35 * ZEXT816(0x1000003d10);
    uVar360 = auVar1._0_8_;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = uVar351 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_2d0._8_8_ = uVar360 & 0xfffffffffffff;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar376 * 2;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = unaff_R12;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar367;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar367;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = unaff_R13;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar356;
    auVar301 = auVar38 * auVar192 + auVar301;
    uVar376 = auVar301._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar36 * auVar190 + auVar300 + auVar37 * auVar191 + auVar39 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    auStack_2d0._16_8_ = uVar367 & 0xfffffffffffff;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = (uVar367 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_2d8;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar376 >> 0x34 | auVar301._8_8_ << 0xc;
    auVar302 = auVar40 * ZEXT816(0x1000003d10) + auVar302;
    uVar376 = auVar302._0_8_;
    auStack_2d0._24_8_ = uVar376 & 0xfffffffffffff;
    auStack_2d0._32_8_ = (long)(psStack_2e0->x).n + (uVar376 >> 0x34 | auVar302._8_8_ << 0xc);
    auStack_2d0._40_8_ = 1;
    psStack_2f8 = (secp256k1_gej *)0x123824;
    secp256k1_fe_verify(a_00);
    psVar374 = (secp256k1_gej *)(auStack_2d0 + 0x30);
    psStack_2f8 = (secp256k1_gej *)0x123834;
    secp256k1_fe_mul((secp256k1_fe *)psVar374,(secp256k1_fe *)psVar374,a_00);
    psStack_2f8 = (secp256k1_gej *)0x12383c;
    psVar365 = psVar362;
    secp256k1_fe_verify(&psVar362->x);
    psVar364 = psVar362;
    if (8 < (psVar362->x).magnitude) goto LAB_00123d9d;
    uVar376 = (psVar362->x).n[0];
    uVar367 = (psVar362->x).n[1];
    unaff_R12 = (secp256k1_gej *)(psVar362->x).n[2];
    unaff_R13 = (secp256k1_gej *)(psVar362->x).n[3];
    uVar356 = (psVar362->x).n[4];
    psVar349 = (secp256k1_gej *)0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar376 * 2;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = unaff_R13;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar367 * 2;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = unaff_R12;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar356;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar356;
    uVar351 = SUB168(auVar43 * auVar195,0);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar351 & 0xfffffffffffff;
    auVar1 = auVar42 * auVar194 + auVar41 * auVar193 + auVar44 * ZEXT816(0x1000003d10);
    uVar360 = auVar1._0_8_;
    uStack_2d8 = uVar360 & 0xfffffffffffff;
    auVar303._8_8_ = 0;
    auVar303._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    a_00 = (secp256k1_fe *)(uVar356 * 2);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar376;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = a_00;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar367 * 2;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = unaff_R13;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = unaff_R12;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = unaff_R12;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar351 >> 0x34 | SUB168(auVar43 * auVar195,8) << 0xc;
    auVar1 = auVar45 * auVar196 + auVar303 + auVar46 * auVar197 + auVar47 * auVar198 +
             auVar48 * ZEXT816(0x1000003d10);
    uVar356 = auVar1._0_8_;
    auVar304._8_8_ = 0;
    auVar304._0_8_ = uVar356 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_2e8 = (uVar356 & 0xfffffffffffff) >> 0x30;
    psVar374 = (secp256k1_gej *)(uVar356 & 0xffffffffffff);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar376;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar376;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar367;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = a_00;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (long)unaff_R12 * 2;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = unaff_R13;
    auVar1 = auVar50 * auVar200 + auVar304 + auVar51 * auVar201;
    uVar356 = auVar1._0_8_;
    auVar306._8_8_ = 0;
    auVar306._0_8_ = uVar356 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = (uVar356 & 0xfffffffffffff) << 4 | uStack_2e8;
    auVar1 = auVar49 * auVar199 + ZEXT816(0x1000003d1) * auVar202;
    uVar356 = auVar1._0_8_;
    auStack_2d0._0_8_ = uVar356 & 0xfffffffffffff;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = uVar356 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar376 * 2;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar367;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = unaff_R12;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = a_00;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = unaff_R13;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = unaff_R13;
    auVar2 = auVar53 * auVar204 + auVar306 + auVar54 * auVar205;
    uVar356 = auVar2._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar356 & 0xfffffffffffff;
    auVar1 = auVar52 * auVar203 + auVar305 + auVar55 * ZEXT816(0x1000003d10);
    uVar351 = auVar1._0_8_;
    auVar308._8_8_ = 0;
    auVar308._0_8_ = uVar356 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_2d0._8_8_ = uVar351 & 0xfffffffffffff;
    auVar307._8_8_ = 0;
    auVar307._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar376 * 2;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = unaff_R12;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar367;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar367;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = unaff_R13;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = a_00;
    auVar308 = auVar58 * auVar208 + auVar308;
    uVar376 = auVar308._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar56 * auVar206 + auVar307 + auVar57 * auVar207 + auVar59 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    psVar364 = (secp256k1_gej *)(uVar376 >> 0x34 | auVar308._8_8_ << 0xc);
    auStack_2d0._16_8_ = uVar367 & 0xfffffffffffff;
    auVar309._8_8_ = 0;
    auVar309._0_8_ = (uVar367 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_2d8;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = psVar364;
    auVar309 = auVar60 * ZEXT816(0x1000003d10) + auVar309;
    uVar376 = auVar309._0_8_;
    auStack_2d0._24_8_ = uVar376 & 0xfffffffffffff;
    auStack_2d0._32_8_ = (long)(psVar374->x).n + (uVar376 >> 0x34 | auVar309._8_8_ << 0xc);
    auStack_2d0._40_8_ = 1;
    psStack_2f8 = (secp256k1_gej *)0x123a83;
    psStack_2e0 = psVar374;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2d0);
    psStack_2f8 = (secp256k1_gej *)0x123a8b;
    psVar365 = (secp256k1_gej *)auStack_2d0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2d0);
    psVar375 = (secp256k1_gej *)auStack_2d0._24_8_;
    psVar373 = (secp256k1_gej *)auStack_2d0._16_8_;
    psVar362 = (secp256k1_gej *)auStack_2d0;
    if (8 < (int)auStack_2d0._40_4_) goto LAB_00123da2;
    psVar349 = (secp256k1_gej *)0xfffffffffffff;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auStack_2d0._0_8_ * 2;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = auStack_2d0._24_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_2d0._8_8_ * 2;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = auStack_2d0._16_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_2d0._32_8_;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = auStack_2d0._32_8_;
    uVar376 = SUB168(auVar63 * auVar211,0);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar62 * auVar210 + auVar61 * auVar209 + auVar64 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    uStack_2d8 = uVar367 & 0xfffffffffffff;
    auVar310._8_8_ = 0;
    auVar310._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    a_00 = (secp256k1_fe *)(auStack_2d0._32_8_ * 2);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_2d0._0_8_;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = a_00;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_2d0._8_8_ * 2;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = auStack_2d0._24_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_2d0._16_8_;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = auStack_2d0._16_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar376 >> 0x34 | SUB168(auVar63 * auVar211,8) << 0xc;
    auVar1 = auVar65 * auVar212 + auVar310 + auVar66 * auVar213 + auVar67 * auVar214 +
             auVar68 * ZEXT816(0x1000003d10);
    uVar376 = auVar1._0_8_;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_2e8 = (uVar376 & 0xfffffffffffff) >> 0x30;
    psVar374 = (secp256k1_gej *)(uVar376 & 0xffffffffffff);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_2d0._0_8_;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = auStack_2d0._0_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_2d0._8_8_;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = a_00;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_2d0._16_8_ * 2;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auStack_2d0._24_8_;
    auVar1 = auVar70 * auVar216 + auVar311 + auVar71 * auVar217;
    uVar376 = auVar1._0_8_;
    auVar313._8_8_ = 0;
    auVar313._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = (uVar376 & 0xfffffffffffff) << 4 | uStack_2e8;
    auVar1 = auVar69 * auVar215 + ZEXT816(0x1000003d1) * auVar218;
    uVar367 = auVar1._0_8_;
    auVar312._8_8_ = 0;
    auVar312._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_2d0._0_8_ * 2;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = auStack_2d0._8_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_2d0._16_8_;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = a_00;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_2d0._24_8_;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = auStack_2d0._24_8_;
    auVar2 = auVar73 * auVar220 + auVar313 + auVar74 * auVar221;
    uVar376 = auVar2._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar72 * auVar219 + auVar312 + auVar75 * ZEXT816(0x1000003d10);
    uVar356 = auVar1._0_8_;
    auVar315._8_8_ = 0;
    auVar315._0_8_ = uVar376 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar314._8_8_ = 0;
    auVar314._0_8_ = uVar356 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_2d0._0_8_ * 2;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = auStack_2d0._16_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_2d0._8_8_;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = auStack_2d0._8_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_2d0._24_8_;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = a_00;
    auVar315 = auVar78 * auVar224 + auVar315;
    uVar376 = auVar315._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar76 * auVar222 + auVar314 + auVar77 * auVar223 + auVar79 * ZEXT816(0x1000003d10);
    uVar351 = auVar1._0_8_;
    psVar364 = (secp256k1_gej *)(uVar376 >> 0x34 | auVar315._8_8_ << 0xc);
    auStack_2d0._16_8_ = uVar351 & 0xfffffffffffff;
    auVar316._8_8_ = 0;
    auVar316._0_8_ = (uVar351 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_2d8;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = psVar364;
    auVar316 = auVar80 * ZEXT816(0x1000003d10) + auVar316;
    uVar376 = auVar316._0_8_;
    auStack_2d0._24_8_ = uVar376 & 0xfffffffffffff;
    auStack_2d0._32_8_ = (long)(psVar374->x).n + (uVar376 >> 0x34 | auVar316._8_8_ << 0xc);
    auStack_2d0._40_8_ = 1;
    psStack_2f8 = (secp256k1_gej *)0x123cce;
    psStack_2e0 = psVar374;
    auStack_2d0._0_8_ = uVar367 & 0xfffffffffffff;
    auStack_2d0._8_8_ = uVar356 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2d0);
    psStack_2f8 = (secp256k1_gej *)0x123cd6;
    psVar365 = (secp256k1_gej *)auStack_2d0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2d0);
    if (0x10 < (int)auStack_2d0._40_4_) goto LAB_00123da7;
    psVar364 = (secp256k1_gej *)auStack_2d0;
    auStack_2d0._0_8_ = auStack_2d0._0_8_ * 2;
    auStack_2d0._8_8_ = auStack_2d0._8_8_ * 2;
    auStack_2d0._16_8_ = auStack_2d0._16_8_ * 2;
    auStack_2d0._24_8_ = auStack_2d0._24_8_ * 2;
    auStack_2d0._32_8_ = auStack_2d0._32_8_ << 1;
    auStack_2d0._44_4_ = 0;
    auStack_2d0._40_4_ = auStack_2d0._40_4_ * 2;
    psStack_2f8 = (secp256k1_gej *)0x123d1a;
    secp256k1_fe_verify((secp256k1_fe *)psVar364);
    a_00 = (secp256k1_fe *)(auStack_2d0 + 0x30);
    psStack_2f8 = (secp256k1_gej *)0x123d27;
    secp256k1_fe_verify(a_00);
    psStack_2f8 = (secp256k1_gej *)0x123d2f;
    psVar365 = psVar364;
    secp256k1_fe_verify((secp256k1_fe *)psVar364);
    iStack_278 = auStack_2d0._40_4_ + iStack_278;
    if (iStack_278 < 0x21) {
      auStack_2d0._48_8_ = auStack_2d0._48_8_ + auStack_2d0._0_8_;
      uStack_298 = uStack_298 + auStack_2d0._8_8_;
      uStack_290 = (long)((secp256k1_fe *)auStack_2d0._16_8_)->n + uStack_290;
      uStack_288 = (long)((secp256k1_fe *)auStack_2d0._24_8_)->n + uStack_288;
      uStack_280 = uStack_280 + auStack_2d0._32_8_;
      iStack_274 = 0;
      psStack_2f8 = (secp256k1_gej *)0x123d79;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_2d0 + 0x30));
      psStack_2f8 = (secp256k1_gej *)0x123d81;
      secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_2d0 + 0x30));
      return;
    }
  }
  psStack_2f8 = (secp256k1_gej *)secp256k1_gej_add_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_5d0 = (secp256k1_gej *)0x123dd3;
  psVar363 = psVar374;
  psStack_320 = psVar364;
  psStack_318 = psVar373;
  psStack_310 = psVar375;
  psStack_308 = a_00;
  psStack_300 = psVar349;
  psStack_2f8 = psVar362;
  secp256k1_gej_verify(psVar374);
  psStack_5d0 = (secp256k1_gej *)0x123ddb;
  secp256k1_gej_verify(a);
  psVar362 = a;
  if ((psVar374->infinity != 0) || (psVar362 = psVar374, a->infinity != 0)) {
    memcpy(psVar365,psVar362,0x98);
    return;
  }
  psVar362 = (secp256k1_gej *)&a->z;
  psStack_5d0 = (secp256k1_gej *)0x123e32;
  psVar364 = psVar362;
  psStack_5c0 = psVar365;
  psStack_5b8 = psVar374;
  secp256k1_fe_verify((secp256k1_fe *)psVar362);
  if ((a->z).magnitude < 9) {
    uVar376 = ((secp256k1_fe *)psVar362)->n[0];
    uVar367 = (a->z).n[1];
    psVar373 = (secp256k1_gej *)(a->z).n[2];
    psVar375 = (secp256k1_gej *)(a->z).n[3];
    uVar356 = (a->z).n[4];
    psVar349 = (secp256k1_gej *)0xfffffffffffff;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar376 * 2;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = psVar375;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar367 * 2;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = psVar373;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar356;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar356;
    uVar351 = SUB168(auVar83 * auVar227,0);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar351 & 0xfffffffffffff;
    auVar1 = auVar82 * auVar226 + auVar81 * auVar225 + auVar84 * ZEXT816(0x1000003d10);
    uVar360 = auVar1._0_8_;
    auStack_3b8._56_8_ = uVar360 & 0xfffffffffffff;
    auVar317._8_8_ = 0;
    auVar317._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar356 = uVar356 * 2;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar376;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar356;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar367 * 2;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = psVar375;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = psVar373;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = psVar373;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar351 >> 0x34 | SUB168(auVar83 * auVar227,8) << 0xc;
    auVar1 = auVar85 * auVar228 + auVar317 + auVar86 * auVar229 + auVar87 * auVar230 +
             auVar88 * ZEXT816(0x1000003d10);
    uVar351 = auVar1._0_8_;
    auVar318._8_8_ = 0;
    auVar318._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_4e8._0_8_ = (uVar351 & 0xfffffffffffff) >> 0x30;
    psVar363 = (secp256k1_gej *)(uVar351 & 0xffffffffffff);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar376;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar376;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar367;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar356;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (long)psVar373 * 2;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = psVar375;
    auVar1 = auVar90 * auVar232 + auVar318 + auVar91 * auVar233;
    uVar351 = auVar1._0_8_;
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = (uVar351 & 0xfffffffffffff) << 4 | auStack_4e8._0_8_;
    auVar1 = auVar89 * auVar231 + ZEXT816(0x1000003d1) * auVar234;
    uVar351 = auVar1._0_8_;
    sStack_350.n[0] = uVar351 & 0xfffffffffffff;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = uVar351 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar376 * 2;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar367;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = psVar373;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar356;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = psVar375;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = psVar375;
    auVar2 = auVar93 * auVar236 + auVar320 + auVar94 * auVar237;
    uVar351 = auVar2._0_8_;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar351 & 0xfffffffffffff;
    auVar1 = auVar92 * auVar235 + auVar319 + auVar95 * ZEXT816(0x1000003d10);
    uVar360 = auVar1._0_8_;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = uVar351 >> 0x34 | auVar2._8_8_ << 0xc;
    sStack_350.n[1] = uVar360 & 0xfffffffffffff;
    auVar321._8_8_ = 0;
    auVar321._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar376 * 2;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = psVar373;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar367;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar367;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = psVar375;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar356;
    auVar322 = auVar98 * auVar240 + auVar322;
    uVar376 = auVar322._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar96 * auVar238 + auVar321 + auVar97 * auVar239 + auVar99 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    sStack_350.n[2] = uVar367 & 0xfffffffffffff;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = (uVar367 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_3b8._56_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar376 >> 0x34 | auVar322._8_8_ << 0xc;
    auVar323 = auVar100 * ZEXT816(0x1000003d10) + auVar323;
    uVar376 = auVar323._0_8_;
    sStack_350.n[3] = uVar376 & 0xfffffffffffff;
    sStack_350.n[4] = (long)(psVar363->x).n + (uVar376 >> 0x34 | auVar323._8_8_ << 0xc);
    sStack_350.magnitude = 1;
    sStack_350.normalized = 0;
    psStack_5d0 = (secp256k1_gej *)0x124093;
    psStack_5a0 = (secp256k1_fe *)psVar362;
    auStack_4e8._48_8_ = psVar363;
    secp256k1_fe_verify(&sStack_350);
    psVar374 = psStack_5b8;
    psVar362 = (secp256k1_gej *)&psStack_5b8->z;
    psStack_5d0 = (secp256k1_gej *)0x1240a4;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    if (8 < (psVar374->z).magnitude) goto LAB_00124f4e;
    psVar373 = (secp256k1_gej *)(auStack_3b8 + 0x38);
    uVar376 = ((secp256k1_fe *)psVar362)->n[0];
    uVar367 = (psVar374->z).n[1];
    uVar356 = (psVar374->z).n[2];
    psVar375 = (secp256k1_gej *)(psVar374->z).n[3];
    uVar351 = (psVar374->z).n[4];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar376 * 2;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = psVar375;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar367 * 2;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar356;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar351;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar351;
    uVar360 = SUB168(auVar103 * auVar243,0);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar360 & 0xfffffffffffff;
    auVar1 = auVar102 * auVar242 + auVar101 * auVar241 + auVar104 * ZEXT816(0x1000003d10);
    uVar348 = auVar1._0_8_;
    auStack_4e8._48_8_ = uVar348 & 0xfffffffffffff;
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar348 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar351 = uVar351 * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar376;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar351;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar367 * 2;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = psVar375;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar356;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar356;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar360 >> 0x34 | SUB168(auVar103 * auVar243,8) << 0xc;
    auVar1 = auVar105 * auVar244 + auVar324 + auVar106 * auVar245 + auVar107 * auVar246 +
             auVar108 * ZEXT816(0x1000003d10);
    auStack_4e8._0_8_ = auVar1._0_8_;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = (ulong)auStack_4e8._0_8_ >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_548._48_8_ = (auStack_4e8._0_8_ & 0xfffffffffffff) >> 0x30;
    auStack_4e8._0_8_ = auStack_4e8._0_8_ & 0xffffffffffff;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar376;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar376;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar367;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar351;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar356 * 2;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = psVar375;
    auVar1 = auVar110 * auVar248 + auVar325 + auVar111 * auVar249;
    uVar360 = auVar1._0_8_;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = (uVar360 & 0xfffffffffffff) << 4 | auStack_548._48_8_;
    auVar1 = auVar109 * auVar247 + ZEXT816(0x1000003d1) * auVar250;
    uVar360 = auVar1._0_8_;
    auStack_3b8._56_8_ = uVar360 & 0xfffffffffffff;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = uVar360 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar376 * 2;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar367;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar356;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar351;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = psVar375;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = psVar375;
    auVar2 = auVar113 * auVar252 + auVar327 + auVar114 * auVar253;
    uVar360 = auVar2._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar360 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar251 + auVar326 + auVar115 * ZEXT816(0x1000003d10);
    uVar348 = auVar1._0_8_;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = uVar360 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_378 = uVar348 & 0xfffffffffffff;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = uVar348 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar376 * 2;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar356;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar367;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar367;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = psVar375;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar351;
    auVar329 = auVar118 * auVar256 + auVar329;
    uVar376 = auVar329._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar116 * auVar254 + auVar328 + auVar117 * auVar255 + auVar119 * ZEXT816(0x1000003d10)
    ;
    uVar367 = auVar1._0_8_;
    uStack_370 = uVar367 & 0xfffffffffffff;
    auVar330._8_8_ = 0;
    auVar330._0_8_ =
         (long)(((secp256k1_gej *)auStack_4e8._48_8_)->x).n +
         (uVar367 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar376 >> 0x34 | auVar329._8_8_ << 0xc;
    auVar330 = auVar120 * ZEXT816(0x1000003d10) + auVar330;
    uVar376 = auVar330._0_8_;
    uStack_368 = uVar376 & 0xfffffffffffff;
    lStack_360 = (uVar376 >> 0x34 | auVar330._8_8_ << 0xc) + auStack_4e8._0_8_;
    uStack_358 = 1;
    psStack_5d0 = (secp256k1_gej *)0x124309;
    psStack_5a8 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar373);
    psVar374 = psStack_5b8;
    psVar362 = (secp256k1_gej *)(auStack_4e8 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x12432c;
    secp256k1_fe_mul((secp256k1_fe *)psVar362,&psStack_5b8->x,&sStack_350);
    psStack_5d0 = (secp256k1_gej *)0x12433f;
    secp256k1_fe_mul((secp256k1_fe *)auStack_4e8,&a->x,(secp256k1_fe *)psVar373);
    psVar349 = (secp256k1_gej *)(auStack_548 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x124356;
    secp256k1_fe_mul((secp256k1_fe *)psVar349,&psVar374->y,&sStack_350);
    psStack_5d0 = (secp256k1_gej *)0x124366;
    secp256k1_fe_mul((secp256k1_fe *)psVar349,(secp256k1_fe *)psVar349,psStack_5a0);
    psVar374 = (secp256k1_gej *)auStack_488;
    psStack_5d0 = (secp256k1_gej *)0x124380;
    secp256k1_fe_mul((secp256k1_fe *)psVar374,&a->y,(secp256k1_fe *)psVar373);
    psStack_5d0 = (secp256k1_gej *)0x124390;
    psVar363 = psVar374;
    secp256k1_fe_mul((secp256k1_fe *)psVar374,(secp256k1_fe *)psVar374,&psStack_5a8->x);
    psStack_5d0 = (secp256k1_gej *)0x124398;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    if (1 < iStack_490) goto LAB_00124f53;
    psVar349 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_4e8._48_8_);
    psVar373 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_4b0);
    psVar375 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_4a8);
    psVar374 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_4a0);
    uStack_3c0 = 2;
    psStack_5d0 = (secp256k1_gej *)0x124419;
    auStack_418._48_8_ = psVar349;
    psStack_3e0 = psVar373;
    psStack_3d8 = psVar375;
    psStack_3d0 = psVar374;
    uStack_3c8 = 0x3fffffffffffc - uStack_498;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    psStack_5d0 = (secp256k1_gej *)0x124421;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    psVar362 = (secp256k1_gej *)auStack_4e8;
    psStack_5d0 = (secp256k1_gej *)0x124431;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    if (0x1e < (int)auStack_4e8._40_4_) goto LAB_00124f58;
    psVar349 = (secp256k1_gej *)((long)(psVar349->x).n + auStack_4e8._0_8_);
    psVar373 = (secp256k1_gej *)((long)(psVar373->x).n + auStack_4e8._8_8_);
    psVar375 = (secp256k1_gej *)((long)(psVar375->x).n + auStack_4e8._16_8_);
    psVar374 = (secp256k1_gej *)((long)(psVar374->x).n + auStack_4e8._24_8_);
    uStack_5b0 = (0x3fffffffffffc - uStack_498) + auStack_4e8._32_8_;
    uStack_3c0 = (ulong)(auStack_4e8._40_4_ + 2);
    psStack_5d0 = (secp256k1_gej *)0x1244ab;
    psStack_578 = psVar375;
    psStack_570 = psVar374;
    psStack_568 = psVar349;
    psStack_560 = psVar373;
    auStack_418._48_8_ = psVar349;
    psStack_3e0 = psVar373;
    psStack_3d8 = psVar375;
    psStack_3d0 = psVar374;
    uStack_3c8 = uStack_5b0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    psVar362 = (secp256k1_gej *)auStack_488;
    psStack_5d0 = (secp256k1_gej *)0x1244bb;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    if (1 < (int)auStack_488._40_4_) goto LAB_00124f5d;
    psVar374 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_488._0_8_);
    psVar349 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_488._8_8_);
    psVar373 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_488._16_8_);
    psVar375 = (secp256k1_gej *)(0x3fffffffffffc - auStack_488._32_8_);
    auStack_418._40_8_ = 2;
    psStack_5d0 = (secp256k1_gej *)0x12453c;
    auStack_418._0_8_ = psVar374;
    auStack_418._8_8_ = psVar349;
    auStack_418._16_8_ = psVar373;
    auStack_418._24_8_ = (secp256k1_gej *)(0x3ffffffffffffc - auStack_488._24_8_);
    auStack_418._32_8_ = psVar375;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    psStack_5d0 = (secp256k1_gej *)0x124544;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    psVar362 = (secp256k1_gej *)(auStack_548 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x124554;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    if (0x1e < (int)uStack_4f0) goto LAB_00124f62;
    psStack_588 = (secp256k1_gej *)((long)(psVar374->x).n + auStack_548._48_8_);
    psStack_590 = (secp256k1_gej *)((long)(psVar349->x).n + uStack_510);
    psVar373 = (secp256k1_gej *)((long)(psVar373->x).n + uStack_508);
    psVar374 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)(0x3ffffffffffffc - auStack_488._24_8_))->x).n + uStack_500
               );
    psVar375 = (secp256k1_gej *)((long)(psVar375->x).n + uStack_4f8);
    auStack_418._44_4_ = 0;
    auStack_418._40_4_ = uStack_4f0 + 2;
    psStack_5d0 = (secp256k1_gej *)0x1245d3;
    psStack_598 = psVar373;
    uStack_580 = (ulong)uStack_4f0;
    auStack_418._0_8_ = psStack_588;
    auStack_418._8_8_ = psStack_590;
    auStack_418._16_8_ = psVar373;
    auStack_418._24_8_ = psVar374;
    auStack_418._32_8_ = psVar375;
    secp256k1_fe_verify((secp256k1_fe *)auStack_418);
    psStack_5d0 = (secp256k1_gej *)0x1245e0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_418 + 0x30));
    psVar349 = psStack_5c0;
    uVar376 = (uStack_5b0 >> 0x30) * 0x1000003d1 + (long)psStack_568;
    if (((uVar376 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar376 & 0xfffffffffffff) == 0)) {
      uVar360 = (long)(psStack_560->x).n + (uVar376 >> 0x34);
      uVar367 = (long)(psStack_578->x).n + (uVar360 >> 0x34);
      uVar356 = (long)(psStack_570->x).n + (uVar367 >> 0x34);
      uVar351 = (uVar356 >> 0x34) + (uStack_5b0 & 0xffffffffffff);
      if ((((uVar360 | uVar376 | uVar367 | uVar356) & 0xfffffffffffff) == 0 && uVar351 == 0) ||
         (((uVar376 | 0x1000003d0) & uVar360 & uVar367 & uVar356 & (uVar351 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_5d0 = (secp256k1_gej *)0x124e86;
        secp256k1_fe_verify((secp256k1_fe *)auStack_418);
        uVar376 = ((ulong)psVar375 >> 0x30) * 0x1000003d1 + (long)psStack_588;
        if (((uVar376 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar376 & 0xfffffffffffff) == 0))
        {
          uVar360 = (long)(psStack_590->x).n + (uVar376 >> 0x34);
          uVar367 = (long)(psStack_598->x).n + (uVar360 >> 0x34);
          uVar356 = (long)(psVar374->x).n + (uVar367 >> 0x34);
          uVar351 = (uVar356 >> 0x34) + ((ulong)psVar375 & 0xffffffffffff);
          if ((((uVar360 | uVar376 | uVar367 | uVar356) & 0xfffffffffffff) == 0 && uVar351 == 0) ||
             (((uVar376 | 0x1000003d0) & uVar360 & uVar367 & uVar356 & (uVar351 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_5d0 = (secp256k1_gej *)0x124f37;
            secp256k1_gej_double_var(psStack_5c0,psStack_5b8,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_5d0 = (secp256k1_gej *)0x124f24;
        secp256k1_gej_set_infinity(psStack_5c0);
        return;
      }
    }
    psStack_5c0->infinity = 0;
    psVar374 = (secp256k1_gej *)(auStack_488 + 0x30);
    psVar362 = (secp256k1_gej *)(auStack_418 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x1246cf;
    secp256k1_fe_mul((secp256k1_fe *)psVar374,(secp256k1_fe *)psVar362,psStack_5a0);
    psStack_5d0 = (secp256k1_gej *)0x1246e0;
    psVar363 = psStack_5a8;
    secp256k1_fe_mul(&psVar349->z,&psStack_5a8->x,(secp256k1_fe *)psVar374);
    psStack_5d0 = (secp256k1_gej *)0x1246e8;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    psVar370 = psStack_3d0;
    psVar365 = psStack_3d8;
    if (8 < (int)uStack_3c0) goto LAB_00124f67;
    psVar364 = (secp256k1_gej *)auStack_3b8;
    psVar349 = (secp256k1_gej *)0xfffffffffffff;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_418._48_8_ * 2;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = psStack_3d0;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = (long)psStack_3e0 * 2;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = psStack_3d8;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uStack_3c8;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uStack_3c8;
    uVar376 = SUB168(auVar123 * auVar259,0);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar122 * auVar258 + auVar121 * auVar257 + auVar124 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    auStack_548._0_8_ = uVar367 & 0xfffffffffffff;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    psVar374 = (secp256k1_gej *)(uStack_3c8 * 2);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_418._48_8_;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = psVar374;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = (long)psStack_3e0 * 2;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = psStack_3d0;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = psStack_3d8;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = psStack_3d8;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar376 >> 0x34 | SUB168(auVar123 * auVar259,8) << 0xc;
    auVar1 = auVar125 * auVar260 + auVar331 + auVar126 * auVar261 + auVar127 * auVar262 +
             auVar128 * ZEXT816(0x1000003d10);
    uVar376 = auVar1._0_8_;
    auVar332._8_8_ = 0;
    auVar332._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    psStack_558 = (secp256k1_gej *)((uVar376 & 0xfffffffffffff) >> 0x30);
    psVar363 = (secp256k1_gej *)(uVar376 & 0xffffffffffff);
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auStack_418._48_8_;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = auStack_418._48_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = psStack_3e0;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = psVar374;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (long)psStack_3d8 * 2;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = psStack_3d0;
    auVar1 = auVar130 * auVar264 + auVar332 + auVar131 * auVar265;
    uVar376 = auVar1._0_8_;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = (uVar376 & 0xfffffffffffff) << 4 | (ulong)psStack_558;
    auVar1 = auVar129 * auVar263 + ZEXT816(0x1000003d1) * auVar266;
    uVar376 = auVar1._0_8_;
    auStack_3b8._0_8_ = uVar376 & 0xfffffffffffff;
    auVar333._8_8_ = 0;
    auVar333._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_418._48_8_ * 2;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = psStack_3e0;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = psStack_3d8;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = psVar374;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = psStack_3d0;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = psStack_3d0;
    auVar2 = auVar133 * auVar268 + auVar334 + auVar134 * auVar269;
    uVar376 = auVar2._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar132 * auVar267 + auVar333 + auVar135 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = uVar376 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_3b8._8_8_ = uVar367 & 0xfffffffffffff;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_418._48_8_ * 2;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = psStack_3d8;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = psStack_3e0;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = psStack_3e0;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = psStack_3d0;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = psVar374;
    auVar336 = auVar138 * auVar272 + auVar336;
    uVar376 = auVar336._0_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar136 * auVar270 + auVar335 + auVar137 * auVar271 + auVar139 * ZEXT816(0x1000003d10)
    ;
    uVar367 = auVar1._0_8_;
    psVar362 = (secp256k1_gej *)(uVar376 >> 0x34 | auVar336._8_8_ << 0xc);
    auStack_3b8._16_8_ = uVar367 & 0xfffffffffffff;
    auVar337._8_8_ = 0;
    auVar337._0_8_ = (uVar367 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_548._0_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = psVar362;
    auVar337 = auVar140 * ZEXT816(0x1000003d10) + auVar337;
    uVar376 = auVar337._0_8_;
    auStack_3b8._24_8_ = uVar376 & 0xfffffffffffff;
    auStack_3b8._32_8_ = (long)(psVar363->x).n + (uVar376 >> 0x34 | auVar337._8_8_ << 0xc);
    auStack_3b8._40_4_ = 1;
    auStack_3b8._44_4_ = 0;
    psStack_5d0 = (secp256k1_gej *)0x124938;
    psStack_550 = psVar363;
    secp256k1_fe_verify((secp256k1_fe *)psVar364);
    psStack_5d0 = (secp256k1_gej *)0x124940;
    secp256k1_fe_verify((secp256k1_fe *)psVar364);
    if (1 < (int)auStack_3b8._40_4_) goto LAB_00124f6c;
    auStack_3b8._0_8_ = 0x3ffffbfffff0bc - auStack_3b8._0_8_;
    auStack_3b8._8_8_ = 0x3ffffffffffffc - auStack_3b8._8_8_;
    auStack_3b8._16_8_ = 0x3ffffffffffffc - auStack_3b8._16_8_;
    auStack_3b8._24_8_ = 0x3ffffffffffffc - auStack_3b8._24_8_;
    auStack_3b8._32_8_ = 0x3fffffffffffc - auStack_3b8._32_8_;
    auStack_3b8._40_4_ = 2;
    auStack_3b8._44_4_ = 0;
    psStack_5d0 = (secp256k1_gej *)0x124996;
    secp256k1_fe_verify((secp256k1_fe *)auStack_3b8);
    psStack_5d0 = (secp256k1_gej *)0x1249ae;
    secp256k1_fe_mul((secp256k1_fe *)auStack_548,(secp256k1_fe *)auStack_3b8,
                     (secp256k1_fe *)(auStack_418 + 0x30));
    psVar363 = (secp256k1_gej *)(auStack_4e8 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x1249c6;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_488 + 0x30),(secp256k1_fe *)psVar363,
                     (secp256k1_fe *)auStack_3b8);
    psVar362 = (secp256k1_gej *)auStack_418;
    psStack_5d0 = (secp256k1_gej *)0x1249d6;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    psVar350 = (secp256k1_gej *)auStack_418._24_8_;
    psVar375 = (secp256k1_gej *)auStack_418._16_8_;
    psVar373 = psStack_5c0;
    psVar364 = psStack_5c0;
    if (6 < (int)uStack_580) goto LAB_00124f71;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = auStack_418._0_8_ * 2;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = auStack_418._24_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auStack_418._8_8_ * 2;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = auStack_418._16_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_418._32_8_;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = auStack_418._32_8_;
    uVar376 = SUB168(auVar143 * auVar275,0);
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar142 * auVar274 + auVar141 * auVar273 + auVar144 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    psStack_550 = (secp256k1_gej *)(uVar367 & 0xfffffffffffff);
    auVar338._8_8_ = 0;
    auVar338._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    psVar374 = (secp256k1_gej *)(auStack_418._32_8_ * 2);
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auStack_418._0_8_;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = psVar374;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = auStack_418._8_8_ * 2;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = auStack_418._24_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = auStack_418._16_8_;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = auStack_418._16_8_;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar376 >> 0x34 | SUB168(auVar143 * auVar275,8) << 0xc;
    auVar1 = auVar145 * auVar276 + auVar338 + auVar146 * auVar277 + auVar147 * auVar278 +
             auVar148 * ZEXT816(0x1000003d10);
    uVar376 = auVar1._0_8_;
    auVar339._8_8_ = 0;
    auVar339._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_420 = (uVar376 & 0xfffffffffffff) >> 0x30;
    psVar363 = (secp256k1_gej *)(uVar376 & 0xffffffffffff);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = auStack_418._0_8_;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = auStack_418._0_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = auStack_418._8_8_;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = psVar374;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = auStack_418._16_8_ * 2;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = auStack_418._24_8_;
    auVar1 = auVar150 * auVar280 + auVar339 + auVar151 * auVar281;
    uVar376 = auVar1._0_8_;
    auVar341._8_8_ = 0;
    auVar341._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = (uVar376 & 0xfffffffffffff) << 4 | uStack_420;
    auVar1 = auVar149 * auVar279 + ZEXT816(0x1000003d1) * auVar282;
    uVar376 = auVar1._0_8_;
    (psStack_5c0->x).n[0] = uVar376 & 0xfffffffffffff;
    auVar340._8_8_ = 0;
    auVar340._0_8_ = uVar376 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = auStack_418._0_8_ * 2;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = auStack_418._8_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = auStack_418._16_8_;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = psVar374;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = auStack_418._24_8_;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = auStack_418._24_8_;
    auVar2 = auVar153 * auVar284 + auVar341 + auVar154 * auVar285;
    uVar376 = auVar2._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar152 * auVar283 + auVar340 + auVar155 * ZEXT816(0x1000003d10);
    uVar367 = auVar1._0_8_;
    auVar343._8_8_ = 0;
    auVar343._0_8_ = uVar376 >> 0x34 | auVar2._8_8_ << 0xc;
    (psStack_5c0->x).n[1] = uVar367 & 0xfffffffffffff;
    auVar342._8_8_ = 0;
    auVar342._0_8_ = uVar367 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = auStack_418._0_8_ * 2;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = auStack_418._16_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = auStack_418._8_8_;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = auStack_418._8_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = auStack_418._24_8_;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = psVar374;
    auVar343 = auVar158 * auVar288 + auVar343;
    uVar376 = auVar343._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar376 & 0xfffffffffffff;
    auVar1 = auVar156 * auVar286 + auVar342 + auVar157 * auVar287 + auVar159 * ZEXT816(0x1000003d10)
    ;
    uVar367 = auVar1._0_8_;
    (psStack_5c0->x).n[2] = uVar367 & 0xfffffffffffff;
    auVar344._8_8_ = 0;
    auVar344._0_8_ = (long)(psStack_550->x).n + (uVar367 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar376 >> 0x34 | auVar343._8_8_ << 0xc;
    auVar344 = auVar160 * ZEXT816(0x1000003d10) + auVar344;
    uVar376 = auVar344._0_8_;
    (psStack_5c0->x).n[3] = uVar376 & 0xfffffffffffff;
    (psStack_5c0->x).n[4] = (long)(psVar363->x).n + (uVar376 >> 0x34 | auVar344._8_8_ << 0xc);
    (psStack_5c0->x).magnitude = 1;
    (psStack_5c0->x).normalized = 0;
    psStack_5d0 = (secp256k1_gej *)0x124c29;
    psStack_558 = psVar363;
    secp256k1_fe_verify(&psStack_5c0->x);
    psStack_5d0 = (secp256k1_gej *)0x124c31;
    secp256k1_fe_verify(&psVar373->x);
    psVar362 = (secp256k1_gej *)auStack_548;
    psStack_5d0 = (secp256k1_gej *)0x124c41;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    iVar355 = auStack_548._40_4_ + (psVar373->x).magnitude;
    if (0x20 < iVar355) goto LAB_00124f76;
    uVar345 = (psVar373->x).n[1];
    uVar346 = (psVar373->x).n[2];
    uVar347 = (psVar373->x).n[3];
    (psVar373->x).n[0] = (psVar373->x).n[0] + auStack_548._0_8_;
    (psVar373->x).n[1] = uVar345 + auStack_548._8_8_;
    (psVar373->x).n[2] = uVar346 + auStack_548._16_8_;
    (psVar373->x).n[3] = uVar347 + auStack_548._24_8_;
    puVar369 = (psVar373->x).n + 4;
    *puVar369 = *puVar369 + auStack_548._32_8_;
    (psVar373->x).magnitude = iVar355;
    (psVar373->x).normalized = 0;
    psStack_5d0 = (secp256k1_gej *)0x124c99;
    secp256k1_fe_verify(&psVar373->x);
    psStack_5d0 = (secp256k1_gej *)0x124ca1;
    secp256k1_fe_verify(&psVar373->x);
    psVar362 = (secp256k1_gej *)(auStack_488 + 0x30);
    psStack_5d0 = (secp256k1_gej *)0x124cb1;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    iVar355 = iStack_430 + (psVar373->x).magnitude;
    if (0x20 < iVar355) goto LAB_00124f7b;
    uVar345 = (psVar373->x).n[1];
    uVar346 = (psVar373->x).n[2];
    uVar347 = (psVar373->x).n[3];
    psVar362 = (secp256k1_gej *)(auStack_488 + 0x30);
    (psVar373->x).n[0] = (psVar373->x).n[0] + auStack_488._48_8_;
    (psVar373->x).n[1] = uVar345 + uStack_450;
    (psVar373->x).n[2] = uVar346 + uStack_448;
    (psVar373->x).n[3] = uVar347 + uStack_440;
    puVar369 = (psVar373->x).n + 4;
    *puVar369 = *puVar369 + uStack_438;
    (psVar373->x).magnitude = iVar355;
    (psVar373->x).normalized = 0;
    psStack_5d0 = (secp256k1_gej *)0x124d04;
    secp256k1_fe_verify(&psVar373->x);
    psStack_5d0 = (secp256k1_gej *)0x124d0c;
    secp256k1_fe_verify(&psVar373->x);
    psStack_5d0 = (secp256k1_gej *)0x124d14;
    psVar364 = psVar362;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    iVar355 = iStack_430 + (psVar373->x).magnitude;
    if (0x20 < iVar355) goto LAB_00124f80;
    uVar345 = (psVar373->x).n[1];
    uVar346 = (psVar373->x).n[2];
    uVar347 = (psVar373->x).n[3];
    psVar362 = (secp256k1_gej *)(auStack_488 + 0x30);
    (psVar373->x).n[0] = (psVar373->x).n[0] + auStack_488._48_8_;
    (psVar373->x).n[1] = uVar345 + uStack_450;
    (psVar373->x).n[2] = uVar346 + uStack_448;
    (psVar373->x).n[3] = uVar347 + uStack_440;
    puVar369 = (psVar373->x).n + 4;
    *puVar369 = *puVar369 + uStack_438;
    (psVar373->x).magnitude = iVar355;
    (psVar373->x).normalized = 0;
    psStack_5d0 = (secp256k1_gej *)0x124d67;
    secp256k1_fe_verify(&psVar373->x);
    psStack_5d0 = (secp256k1_gej *)0x124d6f;
    secp256k1_fe_verify((secp256k1_fe *)psVar362);
    psStack_5d0 = (secp256k1_gej *)0x124d77;
    psVar364 = psVar373;
    secp256k1_fe_verify(&psVar373->x);
    iVar355 = (psVar373->x).magnitude + iStack_430;
    if (iVar355 < 0x21) {
      auStack_488._48_8_ = (psVar373->x).n[0] + auStack_488._48_8_;
      uStack_450 = (psVar373->x).n[1] + uStack_450;
      uStack_448 = (psVar373->x).n[2] + uStack_448;
      uStack_440 = (psVar373->x).n[3] + uStack_440;
      uStack_438 = uStack_438 + (psVar373->x).n[4];
      iStack_42c = 0;
      psStack_5d0 = (secp256k1_gej *)0x124dcc;
      iStack_430 = iVar355;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_488 + 0x30));
      psVar362 = (secp256k1_gej *)&psVar373->y;
      psStack_5d0 = (secp256k1_gej *)0x124de3;
      secp256k1_fe_mul((secp256k1_fe *)psVar362,(secp256k1_fe *)(auStack_488 + 0x30),
                       (secp256k1_fe *)auStack_418);
      psVar374 = (secp256k1_gej *)auStack_548;
      psStack_5d0 = (secp256k1_gej *)0x124dfe;
      psVar363 = psVar374;
      secp256k1_fe_mul((secp256k1_fe *)psVar374,(secp256k1_fe *)psVar374,
                       (secp256k1_fe *)(auStack_548 + 0x30));
      psStack_5d0 = (secp256k1_gej *)0x124e06;
      secp256k1_fe_verify((secp256k1_fe *)psVar362);
      psStack_5d0 = (secp256k1_gej *)0x124e0e;
      psVar364 = psVar374;
      secp256k1_fe_verify((secp256k1_fe *)psVar374);
      iVar355 = auStack_548._40_4_ + (psVar373->y).magnitude;
      if (iVar355 < 0x21) {
        uVar345 = (psVar373->y).n[1];
        uVar346 = (psVar373->y).n[2];
        uVar347 = (psVar373->y).n[3];
        (psVar373->y).n[0] = (psVar373->y).n[0] + auStack_548._0_8_;
        (psVar373->y).n[1] = uVar345 + auStack_548._8_8_;
        (psVar373->y).n[2] = uVar346 + auStack_548._16_8_;
        (psVar373->y).n[3] = uVar347 + auStack_548._24_8_;
        puVar369 = (psVar373->y).n + 4;
        *puVar369 = *puVar369 + auStack_548._32_8_;
        (psVar373->y).magnitude = iVar355;
        (psVar373->y).normalized = 0;
        psStack_5d0 = (secp256k1_gej *)0x124e69;
        secp256k1_fe_verify((secp256k1_fe *)psVar362);
        psStack_5d0 = (secp256k1_gej *)0x124e71;
        secp256k1_gej_verify(psVar373);
        return;
      }
      goto LAB_00124f8a;
    }
  }
  else {
    psStack_5d0 = (secp256k1_gej *)0x124f4e;
    secp256k1_gej_add_var_cold_14();
LAB_00124f4e:
    psStack_5d0 = (secp256k1_gej *)0x124f53;
    secp256k1_gej_add_var_cold_13();
LAB_00124f53:
    psStack_5d0 = (secp256k1_gej *)0x124f58;
    secp256k1_gej_add_var_cold_12();
LAB_00124f58:
    psStack_5d0 = (secp256k1_gej *)0x124f5d;
    secp256k1_gej_add_var_cold_11();
LAB_00124f5d:
    psStack_5d0 = (secp256k1_gej *)0x124f62;
    secp256k1_gej_add_var_cold_10();
LAB_00124f62:
    psStack_5d0 = (secp256k1_gej *)0x124f67;
    secp256k1_gej_add_var_cold_9();
LAB_00124f67:
    psVar370 = psVar375;
    psVar365 = psVar373;
    psStack_5d0 = (secp256k1_gej *)0x124f6c;
    secp256k1_gej_add_var_cold_8();
LAB_00124f6c:
    psStack_5d0 = (secp256k1_gej *)0x124f71;
    secp256k1_gej_add_var_cold_7();
LAB_00124f71:
    psVar373 = psVar349;
    psVar350 = psVar370;
    psVar375 = psVar365;
    psStack_5d0 = (secp256k1_gej *)0x124f76;
    secp256k1_gej_add_var_cold_6();
LAB_00124f76:
    psStack_5d0 = (secp256k1_gej *)0x124f7b;
    secp256k1_gej_add_var_cold_5();
LAB_00124f7b:
    psStack_5d0 = (secp256k1_gej *)0x124f80;
    secp256k1_gej_add_var_cold_4();
LAB_00124f80:
    psStack_5d0 = (secp256k1_gej *)0x124f85;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_5d0 = (secp256k1_gej *)0x124f8a;
  secp256k1_gej_add_var_cold_2();
LAB_00124f8a:
  psStack_5d0 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_5f0 = psVar362;
  psStack_5e8 = psVar375;
  psStack_5e0 = psVar350;
  psStack_5d8 = psVar374;
  psStack_5d0 = psVar373;
  memcpy(&sStack_688,psVar363,0x98);
  secp256k1_ge_set_gej_var(&sStack_6f0,&sStack_688);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)psVar364,&sStack_6f0);
  secp256k1_gej_double_var(&sStack_688,psVar363,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_758,&sStack_688);
  lVar354 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_688,&sStack_6f0);
    secp256k1_gej_add_ge_var(&sStack_688,&sStack_688,&sStack_758,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_6f0,&sStack_688);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(psVar364->x).n + lVar354),&sStack_6f0);
    lVar354 = lVar354 + 0x40;
  } while (lVar354 != 0x100);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);
#ifdef VERIFY
    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
#endif
}